

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_32bit(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint8_t *__dest;
  int c;
  ulong uVar9;
  ulong uVar10;
  void *__src;
  long lVar11;
  
  __src = decode->unpacked_buffer;
  uVar1._0_2_ = decode->channel_count;
  uVar1._2_2_ = decode->decode_flags;
  uVar2 = (decode->chunk).height;
  uVar10 = 0;
  uVar5 = (ulong)uVar1;
  if ((short)(undefined2)uVar1 < 1) {
    uVar5 = uVar10;
  }
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar10;
  }
  for (; uVar10 != uVar6; uVar10 = uVar10 + 1) {
    for (uVar9 = 0; uVar9 != (uVar5 & 0xffff); uVar9 = uVar9 + 1) {
      peVar4 = decode->channels;
      lVar11 = (long)peVar4[uVar9].width;
      iVar3 = peVar4[uVar9].user_pixel_stride;
      __dest = peVar4[uVar9].field_12.decode_to_ptr + (long)peVar4[uVar9].user_line_stride * uVar10;
      if ((long)iVar3 == 4) {
        memcpy(__dest,__src,lVar11 << 2);
      }
      else {
        lVar7 = 0;
        if (0 < lVar11) {
          lVar7 = lVar11;
        }
        for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
          *(undefined4 *)__dest = *(undefined4 *)((long)__src + lVar8 * 4);
          __dest = __dest + iVar3;
        }
      }
      __src = (void *)((long)__src + lVar11 * 4);
    }
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_32bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    uint8_t*       cdata;
    int64_t        w, h, pixincrement;
    int            chans = decode->channel_count;

    h = (int64_t) decode->chunk.height;

    for (int64_t y = 0; y < h; ++y)
    {
        for (int c = 0; c < chans; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += y * (int64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 4)
            {
                uint32_t*       tmp = (uint32_t*) cdata;
                const uint32_t* src = (const uint32_t*) srcbuffer;
                uint32_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = le32toh (*src++);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = le32toh (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 4)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) *4);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 4;
        }
    }
    return EXR_ERR_SUCCESS;
}